

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall Assimp::X3DExporter::Export_Mesh(X3DExporter *this,size_t pIdxMesh,size_t pTabLevel)

{
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  size_t pTabLevel_00;
  size_t pTabLevel_01;
  aiMesh *paVar1;
  aiFace *paVar2;
  uint uVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  size_t idx_vert;
  ulong uVar6;
  string *this_01;
  ulong uVar7;
  allocator<char> local_119;
  undefined1 local_118 [64];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  string attr_value;
  size_t pIdxMesh_local;
  string coordIndex;
  string mesh_name;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&attr_list;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = 0;
  paVar1 = this->mScene->mMeshes[pIdxMesh];
  this_00 = &this->mDEF_Map_Mesh;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       attr_list.
       super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pIdxMesh_local = pIdxMesh;
  iVar4 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&pIdxMesh_local);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::string<std::allocator<char>>((string *)&coordIndex,"_IDX_",&local_119);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   (paVar1->mName).data,&coordIndex);
    std::__cxx11::to_string(&attr_value,pIdxMesh_local);
    std::operator+(&mesh_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   &attr_value);
    std::__cxx11::string::~string((string *)&attr_value);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)&coordIndex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"DEF",(allocator<char> *)&coordIndex);
    std::__cxx11::string::string((string *)(local_118 + 0x20),(string *)&mesh_name);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)local_118);
    SAttribute::~SAttribute((SAttribute *)local_118);
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&pIdxMesh_local);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"Shape",(allocator<char> *)&coordIndex);
    NodeHelper_OpenNode(this,(string *)local_118,pTabLevel,false,&attr_list);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              (&attr_list);
    pTabLevel_00 = pTabLevel + 1;
    Export_Material(this,(ulong)paVar1->mMaterialIndex,pTabLevel_00);
    coordIndex._M_dataplus._M_p = (pointer)&coordIndex.field_2;
    coordIndex._M_string_length = 0;
    coordIndex.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&coordIndex);
    for (uVar7 = 0; uVar7 < paVar1->mNumFaces; uVar7 = uVar7 + 1) {
      paVar2 = paVar1->mFaces;
      for (uVar6 = 0; uVar6 < paVar2[uVar7].mNumIndices; uVar6 = uVar6 + 1) {
        std::__cxx11::to_string(&attr_value,paVar2[uVar7].mIndices[uVar6]);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,&attr_value," ");
        std::__cxx11::string::append((string *)&coordIndex);
        std::__cxx11::string::~string((string *)local_118);
        std::__cxx11::string::~string((string *)&attr_value);
      }
      std::__cxx11::string::append((char *)&coordIndex);
    }
    std::__cxx11::string::resize((ulong)&coordIndex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"coordIndex",(allocator<char> *)&attr_value);
    std::__cxx11::string::string((string *)(local_118 + 0x20),(string *)&coordIndex);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)local_118);
    SAttribute::~SAttribute((SAttribute *)local_118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"IndexedFaceSet",(allocator<char> *)&attr_value);
    NodeHelper_OpenNode(this,(string *)local_118,pTabLevel_00,false,&attr_list);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              (&attr_list);
    attr_value._M_dataplus._M_p = (pointer)&attr_value.field_2;
    attr_value._M_string_length = 0;
    attr_value.field_2._M_local_buf[0] = '\0';
    AttrHelper_Vec3DArrToString(this,paVar1->mVertices,(ulong)paVar1->mNumVertices,&attr_value);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"point",&local_119);
    std::__cxx11::string::string((string *)(local_118 + 0x20),(string *)&attr_value);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)local_118);
    SAttribute::~SAttribute((SAttribute *)local_118);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"Coordinate",&local_119);
    pTabLevel_01 = pTabLevel + 2;
    NodeHelper_OpenNode(this,(string *)local_118,pTabLevel_01,true,&attr_list);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              (&attr_list);
    uVar3 = paVar1->mNumVertices;
    if (uVar3 != 0 && paVar1->mColors[0] != (aiColor4D *)0x0) {
      AttrHelper_Col4DArrToString(this,paVar1->mColors[0],(ulong)uVar3,&attr_value);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"color",&local_119);
      std::__cxx11::string::string((string *)(local_118 + 0x20),(string *)&attr_value);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back(&attr_list,(value_type *)local_118);
      SAttribute::~SAttribute((SAttribute *)local_118);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"ColorRGBA",&local_119)
      ;
      NodeHelper_OpenNode(this,(string *)local_118,pTabLevel_01,true,&attr_list);
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
                (&attr_list);
      uVar3 = paVar1->mNumVertices;
    }
    if (uVar3 != 0 && paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
      AttrHelper_Vec3DAsVec2fArrToString(this,paVar1->mTextureCoords[0],(ulong)uVar3,&attr_value);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"point",&local_119);
      std::__cxx11::string::string((string *)(local_118 + 0x20),(string *)&attr_value);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back(&attr_list,(value_type *)local_118);
      SAttribute::~SAttribute((SAttribute *)local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_118,"TextureCoordinate",&local_119);
      NodeHelper_OpenNode(this,(string *)local_118,pTabLevel_01,true,&attr_list);
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
                (&attr_list);
      uVar3 = paVar1->mNumVertices;
    }
    if ((paVar1->mNormals != (aiVector3D *)0x0) && (uVar3 != 0)) {
      AttrHelper_Vec3DArrToString(this,paVar1->mNormals,(ulong)uVar3,&attr_value);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"vector",&local_119);
      std::__cxx11::string::string((string *)(local_118 + 0x20),(string *)&attr_value);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back(&attr_list,(value_type *)local_118);
      SAttribute::~SAttribute((SAttribute *)local_118);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"Normal",&local_119);
      NodeHelper_OpenNode(this,(string *)local_118,pTabLevel_01,true,&attr_list);
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
                (&attr_list);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"IndexedFaceSet",&local_119);
    NodeHelper_CloseNode(this,(string *)local_118,pTabLevel_00);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"Shape",&local_119);
    NodeHelper_CloseNode(this,(string *)local_118,pTabLevel);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)&attr_value);
    std::__cxx11::string::~string((string *)&coordIndex);
    this_01 = &mesh_name;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"USE",(allocator<char> *)&mesh_name);
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(this_00,&pIdxMesh_local);
    std::__cxx11::string::string((string *)(local_118 + 0x20),(string *)pmVar5);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(&attr_list,(value_type *)local_118);
    SAttribute::~SAttribute((SAttribute *)local_118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"Shape",(allocator<char> *)&mesh_name);
    NodeHelper_OpenNode(this,(string *)local_118,pTabLevel,true,&attr_list);
    this_01 = (string *)local_118;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          );
  return;
}

Assistant:

void X3DExporter::Export_Mesh(const size_t pIdxMesh, const size_t pTabLevel)
{
const char* NodeName_IFS = "IndexedFaceSet";
const char* NodeName_Shape = "Shape";

list<SAttribute> attr_list;
aiMesh& mesh = *mScene->mMeshes[pIdxMesh];// create alias for conveniance.

	// Check if mesh already defined early.
	if(mDEF_Map_Mesh.find(pIdxMesh) != mDEF_Map_Mesh.end())
	{
		// Mesh already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Mesh.at(pIdxMesh)});
		NodeHelper_OpenNode(NodeName_Shape, pTabLevel, true, attr_list);

		return;
	}

	string mesh_name(mesh.mName.C_Str() + string("_IDX_") + to_string(pIdxMesh));// Create mesh name

	// Define mesh name.
	attr_list.push_back({"DEF", mesh_name});
	mDEF_Map_Mesh[pIdxMesh] = mesh_name;

	//
	// "Shape" node.
	//
	NodeHelper_OpenNode(NodeName_Shape, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Appearance" node.
	//
	Export_Material(mesh.mMaterialIndex, pTabLevel + 1);

	//
	// "IndexedFaceSet" node.
	//
	// Fill attributes which differ from default. In Assimp for colors, vertices and normals used one indices set. So, only "coordIndex" must be set.
	string coordIndex;

	// fill coordinates index.
	coordIndex.reserve(mesh.mNumVertices * 4);// Index + space + Face delimiter
	for(size_t idx_face = 0; idx_face < mesh.mNumFaces; idx_face++)
	{
		const aiFace& face_cur = mesh.mFaces[idx_face];

		for(size_t idx_vert = 0; idx_vert < face_cur.mNumIndices; idx_vert++)
		{
			coordIndex.append(to_string(face_cur.mIndices[idx_vert]) + " ");
		}

		coordIndex.append("-1 ");// face delimiter.
	}

	// remove last space symbol.
	coordIndex.resize(coordIndex.length() - 1);
	attr_list.push_back({"coordIndex", coordIndex});
	// create node
	NodeHelper_OpenNode(NodeName_IFS, pTabLevel + 1, false, attr_list);
	attr_list.clear();
	// Child nodes for "IndexedFaceSet" needed when used colors, textures or normals.
	string attr_value;

	// Export <Coordinate>
	AttrHelper_Vec3DArrToString(mesh.mVertices, mesh.mNumVertices, attr_value);
	attr_list.push_back({"point", attr_value});
	NodeHelper_OpenNode("Coordinate", pTabLevel + 2, true, attr_list);
	attr_list.clear();

	// Export <ColorRGBA>
	if(mesh.HasVertexColors(0))
	{
		AttrHelper_Col4DArrToString(mesh.mColors[0], mesh.mNumVertices, attr_value);
		attr_list.push_back({"color", attr_value});
		NodeHelper_OpenNode("ColorRGBA", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	// Export <TextureCoordinate>
	if(mesh.HasTextureCoords(0))
	{
		AttrHelper_Vec3DAsVec2fArrToString(mesh.mTextureCoords[0], mesh.mNumVertices, attr_value);
		attr_list.push_back({"point", attr_value});
		NodeHelper_OpenNode("TextureCoordinate", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	// Export <Normal>
	if(mesh.HasNormals())
	{
		AttrHelper_Vec3DArrToString(mesh.mNormals, mesh.mNumVertices, attr_value);
		attr_list.push_back({"vector", attr_value});
		NodeHelper_OpenNode("Normal", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_IFS, pTabLevel + 1);
	NodeHelper_CloseNode(NodeName_Shape, pTabLevel);
}